

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

Curl_cwtype * find_unencode_writer(char *name,size_t len,Curl_cwriter_phase phase)

{
  Curl_cwtype *pCVar1;
  int iVar2;
  Curl_cwtype *ce_1;
  Curl_cwtype *ce;
  Curl_cwtype **cep;
  Curl_cwriter_phase phase_local;
  size_t len_local;
  char *name_local;
  
  if (phase == CURL_CW_TRANSFER_DECODE) {
    for (ce = (Curl_cwtype *)transfer_unencoders; ce->name != (char *)0x0;
        ce = (Curl_cwtype *)&ce->alias) {
      pCVar1 = (Curl_cwtype *)ce->name;
      iVar2 = curl_strnequal(name,pCVar1->name,len);
      if ((iVar2 != 0) && (pCVar1->name[len] == '\0')) {
        return pCVar1;
      }
      if (((pCVar1->alias != (char *)0x0) &&
          (iVar2 = curl_strnequal(name,pCVar1->alias,len), iVar2 != 0)) &&
         (pCVar1->alias[len] == '\0')) {
        return pCVar1;
      }
    }
  }
  ce = (Curl_cwtype *)general_unencoders;
  while( true ) {
    if (ce->name == (char *)0x0) {
      return (Curl_cwtype *)0x0;
    }
    pCVar1 = (Curl_cwtype *)ce->name;
    iVar2 = curl_strnequal(name,pCVar1->name,len);
    if ((iVar2 != 0) && (pCVar1->name[len] == '\0')) break;
    if (((pCVar1->alias != (char *)0x0) &&
        (iVar2 = curl_strnequal(name,pCVar1->alias,len), iVar2 != 0)) &&
       (pCVar1->alias[len] == '\0')) {
      return pCVar1;
    }
    ce = (Curl_cwtype *)&ce->alias;
  }
  return pCVar1;
}

Assistant:

static const struct Curl_cwtype *find_unencode_writer(const char *name,
                                                      size_t len,
                                                      Curl_cwriter_phase phase)
{
  const struct Curl_cwtype * const *cep;

  if(phase == CURL_CW_TRANSFER_DECODE) {
    for(cep = transfer_unencoders; *cep; cep++) {
      const struct Curl_cwtype *ce = *cep;
      if((strncasecompare(name, ce->name, len) && !ce->name[len]) ||
         (ce->alias && strncasecompare(name, ce->alias, len)
                    && !ce->alias[len]))
        return ce;
    }
  }
  /* look among the general decoders */
  for(cep = general_unencoders; *cep; cep++) {
    const struct Curl_cwtype *ce = *cep;
    if((strncasecompare(name, ce->name, len) && !ce->name[len]) ||
       (ce->alias && strncasecompare(name, ce->alias, len) && !ce->alias[len]))
      return ce;
  }
  return NULL;
}